

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::SetForcedPackagePrefix(objectivec *this,string_view prefix)

{
  long lVar1;
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30 [32];
  
  lVar1 = (anonymous_namespace)::g_prefix_mode;
  local_40._M_str = (char *)prefix._M_len;
  local_40._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_30,&local_40,&local_41);
  std::__cxx11::string::operator=((string *)(lVar1 + 0x68),local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SetForcedPackagePrefix(absl::string_view prefix) {
  g_prefix_mode.set_forced_package_prefix(prefix);
}